

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::(anonymous_namespace)::ShaderStorageBlock::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430                   \nstruct U {                     \n   bool a[3];                  \n   mediump vec4 b;             \n   mediump mat3 c;             \n   mediump float d[2];         \n};                             \nstruct UU {                    \n   U a;                        \n   U b[2];                     \n   uvec2 c;                    \n};                             \nlayout(binding=4) buffer TrickyBuffer {          \n   UU a[3];                                      \n   mediump mat4 b;                               \n   uint c;                                       \n} e[2];                                          \nlayout(binding = 0) buffer SimpleBuffer {        \n   mediump mat3x2 a;                             \n   mediump mat4 b;                               \n   mediump vec4 c;                               \n};                                               \nlayout(binding = 1) buffer NotSoSimpleBuffer {   \n   ivec2 a[4];                                   \n   mediump mat3 b[2];                            \n   mediump mat2 c;                               \n} d;                                             \nout mediump vec4 color;                          \nvoid main() {                                    \n    mediump float tmp;                           \n    mediump float tmp2;                          \n    tmp = e[0].a[0].b[0].d[0] * float(e[1].c);   \n    tmp2 = a[0][0] * b[0][0] * c.x;                                \n    tmp2 = tmp2 + float(d.a[0].y) + d.b[0][0][0] + d.c[0][0];      \n    color = vec4(0, 1, 0, 1) * tmp * tmp2;                         \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 430                   \n"
			   ""
			   "struct U {                     \n"
			   "   bool a[3];                  \n"
			   "   mediump vec4 b;             \n"
			   "   mediump mat3 c;             \n"
			   "   mediump float d[2];         \n"
			   "};                             \n"
			   ""
			   "struct UU {                    \n"
			   "   U a;                        \n"
			   "   U b[2];                     \n"
			   "   uvec2 c;                    \n"
			   "};                             \n"
			   ""
			   "layout(binding=4) buffer TrickyBuffer {          \n"
			   "   UU a[3];                                      \n"
			   "   mediump mat4 b;                               \n"
			   "   uint c;                                       \n"
			   "} e[2];                                          \n"
			   ""
			   "layout(binding = 0) buffer SimpleBuffer {        \n"
			   "   mediump mat3x2 a;                             \n"
			   "   mediump mat4 b;                               \n"
			   "   mediump vec4 c;                               \n"
			   "};                                               \n"
			   ""
			   "layout(binding = 1) buffer NotSoSimpleBuffer {   \n"
			   "   ivec2 a[4];                                   \n"
			   "   mediump mat3 b[2];                            \n"
			   "   mediump mat2 c;                               \n"
			   "} d;                                             \n"
			   ""
			   "out mediump vec4 color;                          \n"
			   ""
			   "void main() {                                    \n"
			   "    mediump float tmp;                           \n"
			   "    mediump float tmp2;                          \n"
			   "    tmp = e[0].a[0].b[0].d[0] * float(e[1].c);   \n"
			   "    tmp2 = a[0][0] * b[0][0] * c.x;                                \n"
			   "    tmp2 = tmp2 + float(d.a[0].y) + d.b[0][0][0] + d.c[0][0];      \n"
			   "    color = vec4(0, 1, 0, 1) * tmp * tmp2;                         \n"
			   "}";
	}